

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unlink.cc
# Opt level: O3

int main(int argc,char **argv)

{
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Missing argument\n",0x11);
  }
  else {
    ixxx::posix::unlink(argv[1]);
  }
  return (uint)(argc < 2);
}

Assistant:

int main(int argc, char **argv)
{
    if (argc<2) { cerr << "Missing argument\n"; return 1; }
    try {
        posix::unlink(argv[1]);
    } catch (const ixxx::sys_error& e) {
        cerr << "Error: " << e.what() << '\n';
    }
    return 0;
}